

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::ConstructorOp::evaluate(ConstructorOp *this,ExecutionContext *evalCtx)

{
  pointer ppEVar1;
  int iVar2;
  pointer ppEVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  __tmp;
  ulong uVar6;
  int elemNdx;
  int compNdx;
  int iVar7;
  ConstStridedValueAccess<64> CVar8;
  StridedValueAccess<64> SVar9;
  ExecConstValueAccess src;
  ExecValueAccess dst;
  
  for (ppEVar3 = (this->m_inputExpressions).
                 super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppEVar3 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start; ppEVar3 = ppEVar3 + -1) {
    (*ppEVar3[-1]->_vptr_Expression[4])(ppEVar3[-1],evalCtx);
  }
  ValueStorage<64>::setStorage(&this->m_value,&(this->m_valueRange).m_type);
  dst.super_ConstStridedValueAccess<64>.m_value =
       (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
       .super__Vector_impl_data._M_start;
  ppEVar3 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar2 = 0;
  dst.super_ConstStridedValueAccess<64>.m_type = &(this->m_valueRange).m_type;
  while (iVar7 = iVar2,
        ppEVar3 !=
        (this->m_inputExpressions).
        super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
    ppEVar1 = ppEVar3 + -1;
    ppEVar3 = ppEVar3 + -1;
    iVar2 = (*(*ppEVar1)->_vptr_Expression[5])();
    src.m_type = (VariableType *)CONCAT44(extraout_var,iVar2);
    for (compNdx = 0; iVar2 = iVar7 + compNdx, compNdx < (src.m_type)->m_numElements;
        compNdx = compNdx + 1) {
      CVar8 = ConstStridedValueAccess<64>::component(&src,compNdx);
      SVar9 = StridedValueAccess<64>::component(&dst,iVar7 + compNdx);
      uVar4 = (CVar8.m_type)->m_baseType - TYPE_FLOAT;
      uVar5 = (ulong)uVar4;
      if (2 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar4 = (SVar9.super_ConstStridedValueAccess<64>.m_type)->m_baseType - TYPE_FLOAT;
      uVar6 = (ulong)uVar4;
      if (2 < uVar4) {
        uVar6 = 0xffffffffffffffff;
      }
      (**(code **)(rsg::(anonymous_namespace)::
                   convertExecValue(rsg::ConstStridedValueAccess<int>,rsg::StridedValueAccess<int>)
                   ::convTable + uVar6 * 8 + uVar5 * 0x18))
                (CVar8.m_type,CVar8.m_value,SVar9.super_ConstStridedValueAccess<64>.m_type,
                 SVar9.super_ConstStridedValueAccess<64>.m_value);
    }
  }
  return;
}

Assistant:

void ConstructorOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate children
	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
		(*i)->evaluate(evalCtx);

	// Compute value
	const VariableType& type = m_valueRange.getType();
	m_value.setStorage(type);

	ExecValueAccess	dst				= m_value.getValue(type);
	int				curScalarNdx	= 0;

	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		ExecConstValueAccess src = (*i)->getValue();

		for (int elemNdx = 0; elemNdx < src.getType().getNumElements(); elemNdx++)
			convertExecValue(src.component(elemNdx), dst.component(curScalarNdx++));
	}
}